

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroMixed_Test::~LabelTests_PrintHieroMixed_Test
          (LabelTests_PrintHieroMixed_Test *this)

{
  LabelTests_PrintHieroMixed_Test *this_local;
  
  ~LabelTests_PrintHieroMixed_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroMixed) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {1, 2}}, "X");
  auto nt = rule.nts.front().span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] c\tb [X,1]\t", s.str());
}